

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proc_maps_iterator.cc
# Opt level: O0

bool tcmalloc::anon_unknown_0::ExtractUntilChar(char *text,int c,char **endptr)

{
  char *pcVar1;
  char *found;
  char **endptr_local;
  int c_local;
  char *text_local;
  
  if (text == (char *)0x0) {
    fprintf(_stderr,"%s:%d Check failed: %s %s %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/base/proc_maps_iterator.cc"
            ,0x78,"text","!=","nullptr");
    abort();
  }
  if (endptr == (char **)0x0) {
    fprintf(_stderr,"%s:%d Check failed: %s %s %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/base/proc_maps_iterator.cc"
            ,0x79,"endptr","!=","nullptr");
    abort();
  }
  pcVar1 = strchr(text,c);
  if (pcVar1 != (char *)0x0) {
    *endptr = pcVar1;
    *pcVar1 = '\0';
  }
  else {
    *endptr = (char *)0x0;
  }
  return pcVar1 != (char *)0x0;
}

Assistant:

bool ExtractUntilChar(char *text, int c, char **endptr) {
  CHECK_NE(text, nullptr);
  CHECK_NE(endptr, nullptr);
  char *found;
  found = strchr(text, c);
  if (found == nullptr) {
    *endptr = nullptr;
    return false;
  }

  *endptr = found;
  *found = '\0';
  return true;
}